

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

AssertionResult * __thiscall
iutest::internal::StrCaseEqHelper::Assertion<wchar_t_const*,wchar_t_const*>
          (AssertionResult *__return_storage_ptr__,StrCaseEqHelper *this,char *expr1,char *expr2,
          wchar_t **val1,wchar_t **val2)

{
  wchar_t *__s1;
  wchar_t *__s2;
  int iVar1;
  wchar_t **v;
  wchar_t **v_00;
  wchar_t **extraout_RDX;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __s1 = *(wchar_t **)expr2;
  __s2 = *val1;
  if (__s1 == (wchar_t *)0x0 || __s2 == (wchar_t *)0x0) {
    v = (wchar_t **)expr1;
    if (__s1 == __s2) {
LAB_002b3935:
      (__return_storage_ptr__->m_message)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_message).field_2;
      (__return_storage_ptr__->m_message)._M_string_length = 0;
      (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->m_result = true;
      return __return_storage_ptr__;
    }
  }
  else {
    iVar1 = wcscasecmp(__s1,__s2);
    v = extraout_RDX;
    if (iVar1 == 0) goto LAB_002b3935;
  }
  PrintToString<wchar_t_const*>(&local_50,(iutest *)expr2,v);
  detail::ShowStringQuoted(&local_70,&local_50);
  PrintToString<wchar_t_const*>(&local_b0,(iutest *)val1,v_00);
  detail::ShowStringQuoted(&local_90,&local_b0);
  EqFailure(__return_storage_ptr__,(char *)this,expr1,&local_70,&local_90,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult IUTEST_ATTRIBUTE_UNUSED_ Assertion(
    const char* expr1, const char* expr2
        , const T1& val1, const T2& val2)
{
    if IUTEST_COND_LIKELY( Compare(val1, val2) )
    {
        return AssertionSuccess();
    }

    return EqFailure(expr1, expr2
        , detail::ShowStringQuoted(FormatForComparisonFailureMessage(val1, val2))
        , detail::ShowStringQuoted(FormatForComparisonFailureMessage(val2, val1))
        , true);
}